

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O0

ostream * despot::operator<<(ostream *os,HierarchyCPT *hcpt)

{
  ostream *poVar1;
  const_reference ppNVar2;
  string *psVar3;
  size_type sVar4;
  const_reference ppTVar5;
  int local_1c;
  int i;
  HierarchyCPT *hcpt_local;
  ostream *os_local;
  
  poVar1 = std::operator<<(os,"Root variable: ");
  ppNVar2 = std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::operator[]
                      (&(hcpt->super_CPT).super_Function.parents_,0);
  psVar3 = NamedVar::name_abi_cxx11_(*ppNVar2);
  poVar1 = std::operator<<(poVar1,(string *)psVar3);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_1c = 0;
  while( true ) {
    sVar4 = std::vector<despot::TabularCPT_*,_std::allocator<despot::TabularCPT_*>_>::size
                      (&hcpt->cpts_);
    if (sVar4 <= (ulong)(long)local_1c) break;
    ppNVar2 = std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::operator[]
                        (&(hcpt->super_CPT).super_Function.parents_,0);
    psVar3 = NamedVar::name_abi_cxx11_(*ppNVar2);
    poVar1 = std::operator<<(os,(string *)psVar3);
    poVar1 = std::operator<<(poVar1," = ");
    ppNVar2 = std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::operator[]
                        (&(hcpt->super_CPT).super_Function.parents_,0);
    psVar3 = Variable::GetValue_abi_cxx11_(&(*ppNVar2)->super_Variable,local_1c);
    poVar1 = std::operator<<(poVar1,(string *)psVar3);
    poVar1 = std::operator<<(poVar1," ");
    ppTVar5 = std::vector<despot::TabularCPT_*,_std::allocator<despot::TabularCPT_*>_>::operator[]
                        (&hcpt->cpts_,(long)local_1c);
    poVar1 = operator<<(poVar1,(Function *)*ppTVar5);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    local_1c = local_1c + 1;
  }
  return os;
}

Assistant:

ostream& operator<<(std::ostream& os, const HierarchyCPT& hcpt) {
	os << "Root variable: " << hcpt.parents_[0]->name() << endl;
	for (int i = 0; i < hcpt.cpts_.size(); i++)
		os << hcpt.parents_[0]->name() << " = " << hcpt.parents_[0]->GetValue(i)
			<< " " << *(hcpt.cpts_[i]) << endl;
	return os;
}